

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O0

Formattable * __thiscall icu_63::Formattable::operator=(Formattable *this,Formattable *source)

{
  uint count;
  UBool UVar1;
  Formattable *pFVar2;
  UnicodeString *this_00;
  UObject *pUVar3;
  DecimalQuantity *this_01;
  CharString *pCVar4;
  CharString *local_90;
  DecimalQuantity *local_80;
  UnicodeString *local_70;
  UErrorCode local_38 [2];
  UErrorCode status;
  undefined1 local_21;
  UnicodeString *local_20;
  Formattable *local_18;
  Formattable *source_local;
  Formattable *this_local;
  
  if (this != source) {
    local_18 = source;
    source_local = this;
    dispose(this);
    this->fType = local_18->fType;
    switch(this->fType) {
    case kDate:
      (this->fValue).fObject = (local_18->fValue).fObject;
      break;
    case kDouble:
      (this->fValue).fObject = (local_18->fValue).fObject;
      break;
    case kLong:
    case kInt64:
      (this->fValue).fObject = (local_18->fValue).fObject;
      break;
    case kString:
      this_00 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)source);
      local_21 = 0;
      local_70 = (UnicodeString *)0x0;
      if (this_00 != (UnicodeString *)0x0) {
        local_21 = 1;
        source = (Formattable *)(local_18->fValue).fString;
        local_20 = this_00;
        UnicodeString::UnicodeString(this_00,(UnicodeString *)source);
        local_70 = this_00;
      }
      (this->fValue).fObject = (UObject *)local_70;
      break;
    case kArray:
      (this->fValue).fArrayAndCount.fCount = (local_18->fValue).fArrayAndCount.fCount;
      count = (local_18->fValue).fArrayAndCount.fCount;
      source = (Formattable *)(ulong)count;
      pFVar2 = createArrayCopy((local_18->fValue).fArrayAndCount.fArray,count);
      (this->fValue).fArrayAndCount.fArray = pFVar2;
      break;
    case kObject:
      pUVar3 = objectClone((local_18->fValue).fObject);
      (this->fValue).fObject = pUVar3;
    }
    local_38[0] = U_ZERO_ERROR;
    if (local_18->fDecimalQuantity != (DecimalQuantity *)0x0) {
      this_01 = (DecimalQuantity *)UMemory::operator_new((UMemory *)0x50,(size_t)source);
      local_80 = (DecimalQuantity *)0x0;
      if (this_01 != (DecimalQuantity *)0x0) {
        source = (Formattable *)local_18->fDecimalQuantity;
        icu_63::number::impl::DecimalQuantity::DecimalQuantity(this_01,(DecimalQuantity *)source);
        local_80 = this_01;
      }
      this->fDecimalQuantity = local_80;
    }
    if (local_18->fDecimalStr != (CharString *)0x0) {
      pCVar4 = (CharString *)UMemory::operator_new((UMemory *)0x40,(size_t)source);
      local_90 = (CharString *)0x0;
      if (pCVar4 != (CharString *)0x0) {
        source = (Formattable *)local_18->fDecimalStr;
        CharString::CharString(pCVar4,(CharString *)source,local_38);
        local_90 = pCVar4;
      }
      this->fDecimalStr = local_90;
      UVar1 = ::U_FAILURE(local_38[0]);
      if (UVar1 != '\0') {
        pCVar4 = this->fDecimalStr;
        if (pCVar4 != (CharString *)0x0) {
          CharString::~CharString(pCVar4);
          UMemory::operator_delete((UMemory *)pCVar4,source);
        }
        this->fDecimalStr = (CharString *)0x0;
      }
    }
  }
  return this;
}

Assistant:

Formattable&
Formattable::operator=(const Formattable& source)
{
    if (this != &source)
    {
        // Disposes the current formattable value/setting.
        dispose();

        // Sets the correct data type for this value.
        fType = source.fType;
        switch (fType)
        {
        case kArray:
            // Sets each element in the array one by one and records the array count.
            fValue.fArrayAndCount.fCount = source.fValue.fArrayAndCount.fCount;
            fValue.fArrayAndCount.fArray = createArrayCopy(source.fValue.fArrayAndCount.fArray,
                                                           source.fValue.fArrayAndCount.fCount);
            break;
        case kString:
            // Sets the string value.
            fValue.fString = new UnicodeString(*source.fValue.fString);
            break;
        case kDouble:
            // Sets the double value.
            fValue.fDouble = source.fValue.fDouble;
            break;
        case kLong:
        case kInt64:
            // Sets the long value.
            fValue.fInt64 = source.fValue.fInt64;
            break;
        case kDate:
            // Sets the Date value.
            fValue.fDate = source.fValue.fDate;
            break;
        case kObject:
            fValue.fObject = objectClone(source.fValue.fObject);
            break;
        }

        UErrorCode status = U_ZERO_ERROR;
        if (source.fDecimalQuantity != NULL) {
          fDecimalQuantity = new DecimalQuantity(*source.fDecimalQuantity);
        }
        if (source.fDecimalStr != NULL) {
            fDecimalStr = new CharString(*source.fDecimalStr, status);
            if (U_FAILURE(status)) {
                delete fDecimalStr;
                fDecimalStr = NULL;
            }
        }
    }
    return *this;
}